

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_>::NewKey
          (TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this,
          int key)

{
  Node *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 uVar6;
  FName FVar7;
  short sVar8;
  char cVar9;
  undefined1 uVar10;
  int iVar11;
  undefined4 uVar12;
  Node *pNVar13;
  Node *pNVar14;
  Node *pNVar15;
  Node *pNVar16;
  hash_t hVar17;
  uint uVar18;
  uint uVar19;
  
  pNVar14 = this->Nodes;
  hVar17 = this->Size;
  do {
    uVar19 = hVar17 - 1 & key;
    pNVar1 = pNVar14 + uVar19;
    pNVar13 = pNVar14[uVar19].Next;
    if (pNVar13 == (Node *)0x1) {
LAB_004d9d6b:
      pNVar16 = (Node *)0x0;
      pNVar14 = pNVar1;
LAB_004d9d70:
      pNVar1->Next = pNVar16;
      this->NumUsed = this->NumUsed + 1;
      (pNVar14->Pair).Key = key;
      return pNVar14;
    }
    pNVar16 = this->LastFree;
    while (pNVar15 = pNVar16, pNVar16 = pNVar15 + -1, pNVar14 < pNVar15) {
      if (pNVar16->Next == (Node *)0x1) {
        this->LastFree = pNVar16;
        uVar18 = hVar17 - 1 & (pNVar1->Pair).Key;
        if (uVar18 != uVar19) {
          pNVar14 = pNVar14 + uVar18;
          do {
            pNVar13 = pNVar14;
            pNVar14 = pNVar13->Next;
          } while (pNVar14 != pNVar1);
          pNVar13->Next = pNVar16;
          pNVar14 = pNVar1->Next;
          iVar11 = (pNVar1->Pair).Key;
          uVar12 = *(undefined4 *)&(pNVar1->Pair).field_0x4;
          FVar7.Index = (pNVar1->Pair).Value.classname.Index;
          sVar8 = (pNVar1->Pair).Value.special;
          cVar9 = (pNVar1->Pair).Value.argsdefined;
          uVar10 = (pNVar1->Pair).Value.field_0x7;
          uVar2 = *(undefined8 *)(pNVar1->Pair).Value.args;
          uVar3 = *(undefined8 *)((pNVar1->Pair).Value.args + 2);
          uVar4 = *(undefined8 *)((pNVar1->Pair).Value.args + 4);
          iVar5 = (pNVar1->Pair).Value.linenum;
          uVar6 = *(undefined4 *)&(pNVar1->Pair).Value.field_0x2c;
          pNVar15[-1].Pair.Value.filename.Chars = (pNVar1->Pair).Value.filename.Chars;
          pNVar15[-1].Pair.Value.linenum = iVar5;
          *(undefined4 *)&pNVar15[-1].Pair.Value.field_0x2c = uVar6;
          *(undefined8 *)(pNVar15[-1].Pair.Value.args + 2) = uVar3;
          *(undefined8 *)(pNVar15[-1].Pair.Value.args + 4) = uVar4;
          pNVar15[-1].Pair.Value.classname = (FName)FVar7.Index;
          pNVar15[-1].Pair.Value.special = sVar8;
          pNVar15[-1].Pair.Value.argsdefined = cVar9;
          pNVar15[-1].Pair.Value.field_0x7 = uVar10;
          *(undefined8 *)pNVar15[-1].Pair.Value.args = uVar2;
          pNVar16->Next = pNVar14;
          pNVar15[-1].Pair.Key = iVar11;
          *(undefined4 *)&pNVar15[-1].Pair.field_0x4 = uVar12;
          goto LAB_004d9d6b;
        }
        pNVar16->Next = pNVar13;
        pNVar14 = pNVar16;
        goto LAB_004d9d70;
      }
    }
    this->LastFree = pNVar16;
    Resize(this,hVar17 * 2);
    pNVar14 = this->Nodes;
    hVar17 = this->Size;
  } while( true );
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}